

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::Expression::bindLookupResult
          (Expression *this,Compilation *compilation,LookupResult *result,SourceRange sourceRange,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  LookupResult *this_00;
  bool bVar1;
  SourceLocation SVar2;
  Scope *this_01;
  Symbol *pSVar3;
  SubroutineSymbol *pSVar4;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *pvVar5;
  reference __ptr;
  add_pointer_t<slang::ast::LookupResult::MemberSelector> selector_00;
  Type *pTVar6;
  size_type sVar7;
  ElementSelectSyntax **ppEVar8;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors_00;
  SourceRange range;
  SourceRange SVar9;
  SourceRange range_00;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  undefined1 in_stack_fffffffffffffba8;
  SourceLocation in_stack_fffffffffffffbb0;
  ASTContext *in_stack_fffffffffffffbb8;
  bool local_3f1;
  ElementSelectSyntax *selectSyntax;
  undefined1 local_390 [8];
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors;
  LookupResult nextResult;
  add_pointer_t<slang::ast::LookupResult::MemberSelector> memberSelect;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *selector;
  size_t i;
  bool constraintAllowed;
  undefined1 local_130 [8];
  SourceRange callRange_1;
  void *local_110;
  InvocationExpressionSyntax *local_108;
  InvocationExpressionSyntax *localInvoke;
  SourceLocation local_f8;
  SubroutineSymbol *local_f0;
  undefined1 local_e8 [56];
  undefined1 local_b0 [8];
  SourceRange callRange;
  Expression *expr;
  Scope *scope;
  DataTypeExpression *expr_1;
  Type *resultType;
  undefined1 local_68 [8];
  anon_class_32_4_8f84bd9b errorIfInvoke;
  Symbol *symbol;
  ArrayOrRandomizeMethodExpressionSyntax *withClause_local;
  InvocationExpressionSyntax *invocation_local;
  LookupResult *result_local;
  Compilation *compilation_local;
  SourceRange sourceRange_local;
  
  SVar2 = sourceRange.endLoc;
  sourceRange_local.startLoc = sourceRange.startLoc;
  errorIfInvoke.withClause =
       (ArrayOrRandomizeMethodExpressionSyntax **)(compilation->super_BumpAllocator).head;
  symbol = (Symbol *)invocation;
  withClause_local = (ArrayOrRandomizeMethodExpressionSyntax *)SVar2;
  invocation_local = (InvocationExpressionSyntax *)compilation;
  result_local = (LookupResult *)this;
  compilation_local = (Compilation *)result;
  if ((Segment *)errorIfInvoke.withClause == (Segment *)0x0) {
    sourceRange_local.endLoc = (SourceLocation)badExpr((Compilation *)this,(Expression *)0x0);
  }
  else {
    local_68 = (undefined1  [8])&withClause_local;
    errorIfInvoke.invocation = (InvocationExpressionSyntax **)&compilation_local;
    errorIfInvoke.sourceRange = (SourceRange *)withClause;
    errorIfInvoke.context = (ASTContext *)&symbol;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&resultType,AllowDataType);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)&withClause->method,
                       (bitmask<slang::ast::ASTFlags> *)&resultType);
    local_3f1 = false;
    if (bVar1) {
      local_3f1 = Symbol::isType((Symbol *)errorIfInvoke.withClause);
    }
    if (local_3f1 == false) {
      if ((((withClause_local != (ArrayOrRandomizeMethodExpressionSyntax *)0x0) &&
           (*(int *)errorIfInvoke.withClause == 0x3a)) &&
          (bVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                   ::empty((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                            *)&invocation_local->attributes), bVar1)) &&
         ((this_01 = Symbol::getParentScope((Symbol *)errorIfInvoke.withClause),
          this_01 != (Scope *)0x0 && (pSVar3 = Scope::asSymbol(this_01), pSVar3->kind == Subroutine)
          ))) {
        pSVar3 = Scope::asSymbol(this_01);
        pSVar4 = Symbol::as<slang::ast::SubroutineSymbol>(pSVar3);
        if (pSVar4->returnValVar == (VariableSymbol *)errorIfInvoke.withClause) {
          pSVar3 = Scope::asSymbol(this_01);
          pSVar4 = Symbol::as<slang::ast::SubroutineSymbol>(pSVar3);
          if (pSVar4->subroutineKind != Function) {
            assert::assertFailed
                      ("scope->asSymbol().as<SubroutineSymbol>().subroutineKind == SubroutineKind::Function"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Expression.cpp"
                       ,0x3ba,
                       "static Expression &slang::ast::Expression::bindLookupResult(Compilation &, LookupResult &, SourceRange, const InvocationExpressionSyntax *, const ArrayOrRandomizeMethodExpressionSyntax *, const ASTContext &)"
                      );
          }
          errorIfInvoke.withClause =
               (ArrayOrRandomizeMethodExpressionSyntax **)Scope::asSymbol(this_01);
        }
      }
      switch(*(undefined4 *)errorIfInvoke.withClause) {
      case 0x3e:
        bVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                ::empty((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                         *)&invocation_local->attributes);
        if (!bVar1) {
          assert::assertFailed
                    ("result.selectors.empty()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Expression.cpp"
                     ,0x3c2,
                     "static Expression &slang::ast::Expression::bindLookupResult(Compilation &, LookupResult &, SourceRange, const InvocationExpressionSyntax *, const ArrayOrRandomizeMethodExpressionSyntax *, const ASTContext &)"
                    );
        }
        if (withClause_local == (ArrayOrRandomizeMethodExpressionSyntax *)0x0) {
          callRange.startLoc = sourceRange_local.startLoc;
          local_b0 = (undefined1  [8])compilation_local;
        }
        else {
          _local_b0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)withClause_local);
        }
        this_00 = result_local;
        local_f0 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)errorIfInvoke.withClause);
        std::variant<slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
        ::
        variant<slang::ast::SubroutineSymbol_const*,void,void,slang::ast::SubroutineSymbol_const*,void>
                  ((variant<slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                    *)local_e8,&local_f0);
        localInvoke = (InvocationExpressionSyntax *)local_b0;
        local_f8 = callRange.startLoc;
        in_stack_fffffffffffffbb0 = callRange.startLoc;
        callRange.endLoc =
             (SourceLocation)
             CallExpression::fromLookup
                       ((CallExpression *)this_00,(Compilation *)local_e8,(Subroutine *)0x0,
                        (Expression *)withClause_local,(InvocationExpressionSyntax *)symbol,
                        withClause,_local_b0,in_stack_fffffffffffffbb8);
        withClause_local = (ArrayOrRandomizeMethodExpressionSyntax *)0x0;
        symbol = (Symbol *)0x0;
        break;
      default:
        sourceRange_02.endLoc = (SourceLocation)0x0;
        sourceRange_02.startLoc = sourceRange_local.startLoc;
        callRange.endLoc =
             (SourceLocation)
             ValueExpressionBase::fromSymbol
                       ((ValueExpressionBase *)withClause,(ASTContext *)errorIfInvoke.withClause,
                        (Symbol *)(ulong)(*(byte *)((long)&(invocation_local->left).ptr + 1) & 1),
                        SUB81(compilation_local,0),sourceRange_02,(bool)in_stack_fffffffffffffba8);
        break;
      case 0x46:
        bVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                ::empty((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                         *)&invocation_local->attributes);
        sourceRange_01.endLoc._0_1_ = (bVar1 ^ 0xffU) & 1;
        sourceRange_01.startLoc = sourceRange_local.startLoc;
        sourceRange_01.endLoc._1_7_ = 0;
        callRange.endLoc =
             (SourceLocation)
             ValueExpressionBase::fromSymbol
                       ((ValueExpressionBase *)withClause,(ASTContext *)errorIfInvoke.withClause,
                        (Symbol *)(ulong)(*(byte *)((long)&(invocation_local->left).ptr + 1) & 1),
                        SUB81(compilation_local,0),sourceRange_01,(bool)in_stack_fffffffffffffba8);
        break;
      case 0x4d:
      case 0x4e:
      case 0x53:
        local_108 = (InvocationExpressionSyntax *)0x0;
        bVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                ::empty((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                         *)&invocation_local->attributes);
        if (bVar1) {
          local_110 = (void *)0x0;
          local_108 = std::
                      exchange<slang::syntax::InvocationExpressionSyntax_const*,decltype(nullptr)>
                                ((InvocationExpressionSyntax **)&withClause_local,&local_110);
        }
        range_00.endLoc = (SourceLocation)withClause;
        range_00.startLoc = sourceRange_local.startLoc;
        callRange.endLoc =
             (SourceLocation)
             AssertionInstanceExpression::fromLookup
                       ((AssertionInstanceExpression *)errorIfInvoke.withClause,(Symbol *)local_108,
                        (InvocationExpressionSyntax *)compilation_local,range_00,
                        (ASTContext *)invocation);
        if ((*(int *)errorIfInvoke.withClause == 0x53) &&
           (((ulong)(invocation_local->left).ptr & 0x100) != 0)) {
          if (local_108 == (InvocationExpressionSyntax *)0x0) {
            callRange_1.startLoc = sourceRange_local.startLoc;
            local_130 = (undefined1  [8])compilation_local;
          }
          else {
            _local_130 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_108);
          }
          ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x5b0007,_local_130);
        }
        break;
      case 0x4f:
        range.endLoc = (SourceLocation)withClause;
        range.startLoc = sourceRange_local.startLoc;
        callRange.endLoc =
             (SourceLocation)
             AssertionInstanceExpression::bindPort
                       ((AssertionInstanceExpression *)errorIfInvoke.withClause,
                        (Symbol *)compilation_local,range,(ASTContext *)SVar2);
      }
      for (selector = (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                       *)0x0;
          pvVar5 = (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                    *)SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                      ::size((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                              *)&invocation_local->attributes), selector < pvVar5;
          selector = (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      *)((long)&(selector->
                                super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                ).
                                super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                .
                                super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                .
                                super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                .
                                super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                .
                                super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                ._M_u + 1)) {
        bVar1 = bad((Expression *)callRange.endLoc);
        if (bVar1) {
          return (Expression *)callRange.endLoc;
        }
        __ptr = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                ::operator[]((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                              *)&invocation_local->attributes,(size_type)selector);
        selector_00 = std::
                      get_if<slang::ast::LookupResult::MemberSelector,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                                (__ptr);
        if (selector_00 == (add_pointer_t<slang::ast::LookupResult::MemberSelector>)0x0) {
          ppEVar8 = std::
                    get<slang::syntax::ElementSelectSyntax_const*,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                              (__ptr);
          callRange.endLoc =
               (SourceLocation)
               bindSelector((Compilation *)result_local,(Expression *)callRange.endLoc,*ppEVar8,
                            (ASTContext *)withClause);
        }
        else {
          pTVar6 = not_null<const_slang::ast::Type_*>::operator->
                             ((not_null<const_slang::ast::Type_*> *)((long)callRange.endLoc + 8));
          bVar1 = Type::isVirtualInterface(pTVar6);
          if (bVar1) {
            LookupResult::LookupResult((LookupResult *)&selectors.size_);
            nonstd::span_lite::
            span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
            ::
            span<slang::SmallVector<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_4UL>,_0>
                      ((span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                        *)local_390,
                       (SmallVector<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_4UL>
                        *)&invocation_local->attributes);
            pTVar6 = not_null<const_slang::ast::Type_*>::operator*
                               ((not_null<const_slang::ast::Type_*> *)((long)callRange.endLoc + 8));
            SVar9 = *(SourceRange *)((long)callRange.endLoc + 0x20);
            selectors_00 = nonstd::span_lite::
                           span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                           ::subspan((span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                                      *)local_390,(size_type)selector,0xffffffffffffffff);
            Lookup::selectChild(pTVar6,SVar9,selectors_00,(ASTContext *)withClause,
                                (LookupResult *)&selectors.size_);
            LookupResult::reportDiags((LookupResult *)&selectors.size_,(ASTContext *)withClause);
            if (selectors.size_ == 0) {
              sourceRange_local.endLoc =
                   (SourceLocation)
                   badExpr((Compilation *)result_local,(Expression *)callRange.endLoc);
            }
            else {
              sourceRange_00.endLoc = (SourceLocation)withClause_local;
              sourceRange_00.startLoc = sourceRange_local.startLoc;
              sourceRange_local.endLoc =
                   (SourceLocation)
                   bindLookupResult((Expression *)result_local,(Compilation *)&selectors.size_,
                                    (LookupResult *)compilation_local,sourceRange_00,
                                    (InvocationExpressionSyntax *)symbol,withClause,
                                    (ASTContext *)in_stack_fffffffffffffbb0);
            }
            LookupResult::~LookupResult((LookupResult *)&selectors.size_);
            return (Expression *)sourceRange_local.endLoc;
          }
          pvVar5 = selector;
          sVar7 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                  ::size((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                          *)&invocation_local->attributes);
          if (pvVar5 == (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         *)(sVar7 - 1)) {
            callRange.endLoc =
                 (SourceLocation)
                 MemberAccessExpression::fromSelector
                           ((Compilation *)result_local,(Expression *)callRange.endLoc,selector_00,
                            (InvocationExpressionSyntax *)withClause_local,
                            (ArrayOrRandomizeMethodExpressionSyntax *)symbol,
                            (ASTContext *)withClause);
            if (*(int *)callRange.endLoc == 0x15) {
              withClause_local = (ArrayOrRandomizeMethodExpressionSyntax *)0x0;
              symbol = (Symbol *)0x0;
            }
          }
          else {
            callRange.endLoc =
                 (SourceLocation)
                 MemberAccessExpression::fromSelector
                           ((Compilation *)result_local,(Expression *)callRange.endLoc,selector_00,
                            (InvocationExpressionSyntax *)0x0,
                            (ArrayOrRandomizeMethodExpressionSyntax *)0x0,(ASTContext *)withClause);
          }
        }
      }
      bVar1 = bad((Expression *)callRange.endLoc);
      if ((bVar1) ||
         (bVar1 = bindLookupResult::anon_class_32_4_8f84bd9b::operator()
                            ((anon_class_32_4_8f84bd9b *)local_68), bVar1)) {
        sourceRange_local.endLoc = callRange.endLoc;
      }
      else {
        sourceRange_local.endLoc =
             (SourceLocation)badExpr((Compilation *)result_local,(Expression *)callRange.endLoc);
      }
    }
    else {
      SVar9.endLoc = (SourceLocation)withClause;
      SVar9.startLoc = sourceRange_local.startLoc;
      pTVar6 = Type::fromLookupResult
                         ((Type *)result_local,(Compilation *)invocation_local,
                          (LookupResult *)compilation_local,SVar9,(ASTContext *)invocation);
      SVar2 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange&>
                        ((BumpAllocator *)result_local,pTVar6,(SourceRange *)&compilation_local);
      bVar1 = bad((Expression *)SVar2);
      sourceRange_local.endLoc = SVar2;
      if ((!bVar1) &&
         (bVar1 = bindLookupResult::anon_class_32_4_8f84bd9b::operator()
                            ((anon_class_32_4_8f84bd9b *)local_68), !bVar1)) {
        sourceRange_local.endLoc =
             (SourceLocation)badExpr((Compilation *)result_local,(Expression *)SVar2);
      }
    }
  }
  return (Expression *)sourceRange_local.endLoc;
}

Assistant:

Expression& Expression::bindLookupResult(Compilation& compilation, LookupResult& result,
                                         SourceRange sourceRange,
                                         const InvocationExpressionSyntax* invocation,
                                         const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                         const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(compilation, nullptr);

    auto errorIfInvoke = [&]() {
        // If we require a subroutine, enforce that now. The invocation syntax will have been
        // nulled out if we used it elsewhere in this function.
        if (invocation) {
            SourceLocation loc = invocation->arguments ? invocation->arguments->openParen.location()
                                                       : sourceRange.start();
            auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
            diag << sourceRange;
            return false;
        }
        else if (withClause) {
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
            return false;
        }
        return true;
    };

    if (context.flags.has(ASTFlags::AllowDataType) && symbol->isType()) {
        // We looked up a named data type and we were allowed to do so, so return it.
        const Type& resultType = Type::fromLookupResult(compilation, result, sourceRange, context);
        auto expr = compilation.emplace<DataTypeExpression>(resultType, sourceRange);
        if (!expr->bad() && !errorIfInvoke())
            return badExpr(compilation, expr);

        return *expr;
    }

    // Recursive function call
    if (invocation && symbol->kind == SymbolKind::Variable && result.selectors.empty()) {
        // TODO: check nested scopes?
        auto scope = symbol->getParentScope();
        if (scope && scope->asSymbol().kind == SymbolKind::Subroutine &&
            scope->asSymbol().as<SubroutineSymbol>().returnValVar == symbol) {
            ASSERT(scope->asSymbol().as<SubroutineSymbol>().subroutineKind ==
                   SubroutineKind::Function);
            symbol = &scope->asSymbol();
        }
    }

    Expression* expr;
    switch (symbol->kind) {
        case SymbolKind::Subroutine: {
            ASSERT(result.selectors.empty());
            SourceRange callRange = invocation ? invocation->sourceRange() : sourceRange;
            expr = &CallExpression::fromLookup(compilation, &symbol->as<SubroutineSymbol>(),
                                               nullptr, invocation, withClause, callRange, context);
            invocation = nullptr;
            withClause = nullptr;
            break;
        }
        case SymbolKind::Sequence:
        case SymbolKind::Property:
        case SymbolKind::LetDecl: {
            const InvocationExpressionSyntax* localInvoke = nullptr;
            if (result.selectors.empty())
                localInvoke = std::exchange(invocation, nullptr);

            expr = &AssertionInstanceExpression::fromLookup(*symbol, localInvoke, sourceRange,
                                                            context);

            if (symbol->kind == SymbolKind::LetDecl && result.isHierarchical) {
                SourceRange callRange = localInvoke ? localInvoke->sourceRange() : sourceRange;
                context.addDiag(diag::LetHierarchical, callRange);
            }
            break;
        }
        case SymbolKind::AssertionPort:
            expr = &AssertionInstanceExpression::bindPort(*symbol, sourceRange, context);
            break;
        case SymbolKind::ConstraintBlock: {
            // If there are selectors then this is ok -- either they will be valid because
            // they're accessing a built-in method or they will issue an error.
            bool constraintAllowed = !result.selectors.empty();
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, result.isHierarchical,
                                                    sourceRange, constraintAllowed);
            break;
        }
        default:
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, result.isHierarchical,
                                                    sourceRange);
            break;
    }

    // Drill down into member accesses.
    for (size_t i = 0; i < result.selectors.size(); i++) {
        if (expr->bad())
            return *expr;

        auto& selector = result.selectors[i];
        auto memberSelect = std::get_if<LookupResult::MemberSelector>(&selector);
        if (memberSelect) {
            // If this is an access via a virtual interface we need to look at
            // all the selectors together, as this may constitute a hierarchical reference.
            if (expr->type->isVirtualInterface()) {
                LookupResult nextResult;
                span<LookupResult::Selector> selectors = result.selectors;
                Lookup::selectChild(*expr->type, expr->sourceRange, selectors.subspan(i), context,
                                    nextResult);

                nextResult.reportDiags(context);
                if (!nextResult.found)
                    return badExpr(compilation, expr);

                return bindLookupResult(compilation, nextResult, sourceRange, invocation,
                                        withClause, context);
            }

            if (i == result.selectors.size() - 1) {
                expr = &MemberAccessExpression::fromSelector(compilation, *expr, *memberSelect,
                                                             invocation, withClause, context);

                if (expr->kind == ExpressionKind::Call) {
                    invocation = nullptr;
                    withClause = nullptr;
                }
            }
            else {
                expr = &MemberAccessExpression::fromSelector(compilation, *expr, *memberSelect,
                                                             nullptr, nullptr, context);
            }
        }
        else {
            // Element / range selectors.
            auto selectSyntax = std::get<const ElementSelectSyntax*>(selector);
            expr = &bindSelector(compilation, *expr, *selectSyntax, context);
        }
    }

    if (!expr->bad() && !errorIfInvoke())
        return badExpr(compilation, expr);

    return *expr;
}